

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O0

int replyConnection(void *ptr,mpt_reply_data *rd,mpt_message *msg)

{
  mpt_buffer *buf;
  mpt_connection *con;
  mpt_message *msg_local;
  mpt_reply_data *rd_local;
  void *ptr_local;
  
  if (*(int *)((long)ptr + 8) < 0) {
    if (*ptr == (mpt_stream *)0x0) {
      ptr_local._4_4_ = -1;
    }
    else if ((ushort)*(byte *)((long)ptr + 0xd) == rd->len) {
      ptr_local._4_4_ = mpt_stream_reply(*ptr,(ulong)rd->len,rd->val,msg);
    }
    else {
      ptr_local._4_4_ = -2;
    }
  }
  else {
    ptr_local._4_4_ = mpt_outdata_reply((mpt_outdata *)ptr,(ulong)rd->len,rd->val,msg);
  }
  return ptr_local._4_4_;
}

Assistant:

static int replyConnection(void *ptr, const MPT_STRUCT(reply_data) *rd, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(connection) *con = ptr;
	
	if (!MPT_socket_active(&con->out.sock)) {
		MPT_STRUCT(buffer) *buf;
		
		if (!(buf = con->out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		if (con->out._idlen != rd->len) {
			return MPT_ERROR(BadValue);
		}
		return mpt_stream_reply((void *) buf, rd->len, rd->val, msg);
	}
	return mpt_outdata_reply(&con->out, rd->len, rd->val, msg);
}